

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

uint __thiscall Assimp::glTF2Exporter::ExportNodeHierarchy(glTF2Exporter *this,aiNode *n)

{
  Asset *this_00;
  bool bVar1;
  vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *pvVar2;
  uint uVar3;
  uint i;
  ulong uVar4;
  uint i_1;
  Ref<glTF2::Node> RVar5;
  allocator local_81;
  string local_80;
  Ref<glTF2::Node> local_60;
  string local_50;
  
  this_00 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_50,(n->mName).data,&local_81);
  glTF2::Asset::FindUniqueID(&local_80,this_00,&local_50,"node");
  RVar5 = glTF2::LazyDict<glTF2::Node>::Create(&this_00->nodes,local_80._M_dataplus._M_p);
  pvVar2 = RVar5.vector;
  uVar3 = RVar5.index;
  local_60.vector = pvVar2;
  local_60.index = uVar3;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::assign
            ((char *)&((pvVar2->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar3]->super_Object).name);
  bVar1 = aiMatrix4x4t<float>::IsIdentity(&n->mTransformation);
  if (!bVar1) {
    ((pvVar2->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
     super__Vector_impl_data._M_start[uVar3]->matrix).isPresent = true;
    CopyValue(&n->mTransformation,
              ((pvVar2->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar3]->matrix).value);
  }
  for (uVar4 = 0; uVar4 < n->mNumMeshes; uVar4 = uVar4 + 1) {
    local_80._M_string_length._0_4_ = n->mMeshes[uVar4];
    local_80._M_dataplus._M_p =
         (pointer)&(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->meshes).mObjs;
    std::vector<glTF2::Ref<glTF2::Mesh>,std::allocator<glTF2::Ref<glTF2::Mesh>>>::
    emplace_back<glTF2::Ref<glTF2::Mesh>>
              ((vector<glTF2::Ref<glTF2::Mesh>,std::allocator<glTF2::Ref<glTF2::Mesh>>> *)
               &(pvVar2->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3]->meshes,(Ref<glTF2::Mesh> *)&local_80);
  }
  for (uVar4 = 0; uVar4 < n->mNumChildren; uVar4 = uVar4 + 1) {
    local_80._M_string_length._0_4_ = ExportNode(this,n->mChildren[uVar4],&local_60);
    local_80._M_dataplus._M_p =
         (pointer)&(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->nodes).mObjs;
    std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
    emplace_back<glTF2::Ref<glTF2::Node>>
              ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
               &(pvVar2->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3]->children,(Ref<glTF2::Node> *)&local_80);
  }
  return uVar3;
}

Assistant:

unsigned int glTF2Exporter::ExportNodeHierarchy(const aiNode* n)
{
    Ref<Node> node = mAsset->nodes.Create(mAsset->FindUniqueID(n->mName.C_Str(), "node"));

    node->name = n->mName.C_Str();

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}